

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_string.hpp
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
jsoncons::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,byte_string_view *bstr)

{
  byte bVar1;
  long lVar2;
  uint8_t *puVar3;
  size_t sVar4;
  bool bVar5;
  size_t sVar6;
  string local_1c8 [32];
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> ss;
  undefined8 uStack_198;
  undefined4 auStack_190 [50];
  undefined1 auStack_c8 [152];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  *(undefined4 *)((long)auStack_190 + *(long *)(_ss + -0x18)) = 8;
  lVar2 = *(long *)(_ss + -0x18);
  std::ios::fill();
  auStack_c8[lVar2] = 0x30;
  puVar3 = bstr->data_;
  sVar4 = bstr->size_;
  bVar5 = true;
  for (sVar6 = 0; sVar4 != sVar6; sVar6 = sVar6 + 1) {
    bVar1 = puVar3[sVar6];
    if (!bVar5) {
      std::operator<<((ostream *)&ss,',');
    }
    *(undefined8 *)((long)&uStack_198 + *(long *)(_ss + -0x18)) = 2;
    std::ostream::operator<<((ostream *)&ss,(uint)bVar1);
    bVar5 = false;
  }
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)os,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  return os;
}

Assistant:

std::basic_ostream<CharT>& operator<<(std::basic_ostream<CharT>& os, const byte_string_view& bstr)
        {
            std::basic_ostringstream<CharT> ss;
            ss.flags(std::ios::hex);
            ss.fill('0');

            bool first = true;
            for (auto b : bstr)
            {
                if (first)
                {
                    first = false;
                }
                else 
                {
                    ss << ',';
                }
                ss << std::setw(2) << static_cast<int>(b);
            }
            os << ss.str();
            return os;
        }